

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap-reduce.cpp
# Opt level: O2

void redistribute(void *b_,ReduceProxy *srp,RegularSwapPartners *partners)

{
  pointer pBVar1;
  BlockID BVar2;
  pointer pvVar3;
  int iVar4;
  mapped_type *bb;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  size_t j;
  ulong uVar9;
  value_type *__x;
  float fVar10;
  float fVar11;
  int local_90;
  int local_8c;
  int nbr_gid;
  int iStack_84;
  float local_80;
  uint round;
  vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
  out_points;
  int local_60;
  
  round = srp->round_;
  for (lVar8 = 0;
      pBVar1 = (srp->in_link_).neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar8 < (int)((ulong)((long)(srp->in_link_).neighbors_.
                                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3);
      lVar8 = lVar8 + 1) {
    iVar4 = pBVar1[lVar8].gid;
    nbr_gid = iVar4;
    if ((srp->super_Proxy).gid_ != iVar4) {
      out_points.
      super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      out_points.
      super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      out_points.
      super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      diy::Master::Proxy::
      dequeue<std::vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>>>
                (&srp->super_Proxy,iVar4,
                 (vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                 &out_points,
                 diy::load<std::vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>>>);
      local_8c = (srp->super_Proxy).gid_;
      local_90 = (int)(((long)out_points.
                              super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)out_points.
                             super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      fmt::v7::print<char[38],int,unsigned_int&,int,int&,char>
                (_stderr,(char (*) [38])"[{}:{}] Received {} points from [{}]\n",&local_8c,&round,
                 &local_90,&nbr_gid);
      lVar5 = 0;
      for (uVar9 = 0;
          uVar9 < (ulong)(((long)out_points.
                                 super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)out_points.
                                super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0xc); uVar9 = uVar9 + 1
          ) {
        Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
        push_back((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                  ((long)b_ + 0x100),
                  (value_type *)
                  ((long)&((out_points.
                            super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + 0xc;
      }
      Catch::clara::std::
      _Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::~_Vector_base
                ((_Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                 &out_points);
    }
  }
  iVar4 = (int)((ulong)((long)(srp->out_link_).neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(srp->out_link_).neighbors_.
                             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
  if (iVar4 != 0) {
    Catch::clara::std::
    vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
    ::vector(&out_points,(long)iVar4,(allocator_type *)&nbr_gid);
    uVar9 = (ulong)((long)(srp->out_link_).neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(srp->out_link_).neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    lVar8 = (long)(partners->super_RegularPartners).kvs_.
                  super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)round].dim;
    iVar4 = (int)uVar9;
    local_80 = (float)iVar4;
    lVar5 = 0;
    uVar6 = 0;
    while( true ) {
      if ((ulong)((*(long *)((long)b_ + 0x108) - *(long *)((long)b_ + 0x100)) / 0xc) <= uVar6)
      break;
      __x = (value_type *)(*(long *)((long)b_ + 0x100) + lVar5);
      fVar10 = *(float *)(*(long *)((long)b_ + 0x88) + lVar8 * 4);
      fVar10 = floorf((((__x->super_array<float,_3UL>)._M_elems[lVar8] - fVar10) /
                      (*(float *)(*(long *)((long)b_ + 200) + lVar8 * 4) - fVar10)) * local_80);
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      push_back(out_points.
                super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start +
                ((long)(fVar10 - 9.223372e+18) & (long)fVar10 >> 0x3f | (long)fVar10),__x);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0xc;
    }
    uVar6 = 0;
    uVar9 = uVar9 & 0xffffffff;
    if (iVar4 < 1) {
      uVar9 = uVar6;
    }
    local_60 = -1;
    for (uVar7 = 0;
        pvVar3 = out_points.
                 super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, uVar9 != uVar7; uVar7 = uVar7 + 1) {
      BVar2 = (srp->out_link_).neighbors_.
              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      if ((srp->super_Proxy).gid_ == BVar2.gid) {
        Catch::clara::std::
        _Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
        _Vector_impl_data::_M_swap_data
                  ((_Vector_impl_data *)((long)b_ + 0x100),
                   (_Vector_impl_data *)
                   ((long)&((out_points.
                             super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar6));
        local_60 = (int)uVar7;
      }
      else {
        _nbr_gid = BVar2;
        bb = Catch::clara::std::
             map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
             ::operator[](&(srp->super_Proxy).outgoing_,(key_type *)&nbr_gid);
        diy::
        Serialization<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>
        ::save(&bb->super_BinaryBuffer,
               (Vector *)
               ((long)&(pvVar3->
                       super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
        local_8c = (srp->super_Proxy).gid_;
        local_90 = (int)((*(long *)((long)&((out_points.
                                             super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish + uVar6) -
                         *(long *)((long)&((out_points.
                                            super__Vector_base<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar6)) / 0xc
                        );
        _nbr_gid = (srp->out_link_).neighbors_.
                   super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
        fmt::v7::print<char[29],int,int,int,char>
                  (_stderr,(char (*) [29])"[{}] Sent {} points to [{}]\n",&local_8c,&local_90,
                   &nbr_gid);
      }
      uVar6 = uVar6 + 0x18;
    }
    lVar5 = *(long *)((long)b_ + 200);
    fVar10 = *(float *)(*(long *)((long)b_ + 0x88) + lVar8 * 4);
    fVar11 = (*(float *)(lVar5 + lVar8 * 4) - fVar10) / local_80;
    *(float *)(*(long *)((long)b_ + 0x88) + lVar8 * 4) = (float)local_60 * fVar11 + fVar10;
    *(float *)(lVar5 + lVar8 * 4) = (float)(local_60 + 1) * fVar11 + fVar10;
    Catch::clara::std::
    vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
    ::~vector(&out_points);
  }
  return;
}

Assistant:

void redistribute(void* b_,                                 // local block
                  const diy::ReduceProxy& srp,              // communication proxy
                  const diy::RegularSwapPartners& partners) // partners of the current block
{
    Block*        b        = static_cast<Block*>(b_);
    unsigned      round    = srp.round();                   // current round number

    // step 1: dequeue
    // dequeue all the incoming points and add them to this block's vector
    // could use srp.incoming() instead
    for (int i = 0; i < srp.in_link().size(); ++i)
    {
        int nbr_gid = srp.in_link().target(i).gid;
        if (nbr_gid == srp.gid())
            continue;

        std::vector<Block::Point>    in_points;
        srp.dequeue(nbr_gid, in_points);
        fmt::print(stderr, "[{}:{}] Received {} points from [{}]\n",
                   srp.gid(), round, (int) in_points.size(), nbr_gid);
        for (size_t j = 0; j < in_points.size(); ++j)
            b->points.push_back(in_points[j]);
    }

    // step 2: sort and enqueue
    if (srp.out_link().size() == 0)        // final round; nothing needs to be sent
        return;

    std::vector< std::vector<Block::Point> > out_points(srp.out_link().size());
    int group_size = srp.out_link().size();  // number of outbound partners
    int cur_dim    = partners.dim(round);    // current dimension along which groups are formed
    // sort points into vectors corresponding to neighbor blocks
    for (size_t i = 0; i < b->points.size(); ++i) // for all points
    {
        auto loc = static_cast<size_t>(floor((b->points[i][cur_dim] - b->box.min[cur_dim]) /
                                            (b->box.max[cur_dim] - b->box.min[cur_dim]) * group_size));
        out_points[loc].push_back(b->points[i]);
    }
    int pos = -1;
    // enqueue points to neighbor blocks
    for (int i = 0; i < group_size; ++i)     // for all neighbors
    {
        if (srp.out_link().target(i).gid == srp.gid())
        {
            b->points.swap(out_points[i]);
            pos = i;
        }
        else
        {
            srp.enqueue(srp.out_link().target(i), out_points[i]);
            fmt::print(stderr, "[{}] Sent {} points to [{}]\n",
                       srp.gid(), (int) out_points[i].size(), srp.out_link().target(i).gid);
        }
    }

    // step 3: readjust box boundaries for next round
    float new_min = b->box.min[cur_dim] + (b->box.max[cur_dim] -
                                           b->box.min[cur_dim])/group_size*pos;
    float new_max = b->box.min[cur_dim] + (b->box.max[cur_dim] -
                                           b->box.min[cur_dim])/group_size*(pos + 1);
    b->box.min[cur_dim] = new_min;
    b->box.max[cur_dim] = new_max;
}